

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void pnga_set_restricted_range(Integer g_a,Integer lo_proc,Integer hi_proc)

{
  long icode;
  global_array_t *pgVar1;
  C_Integer *pCVar2;
  global_array_t *pgVar3;
  uint uVar4;
  long lVar5;
  Integer IVar6;
  C_Integer CVar7;
  long lVar8;
  long lVar9;
  C_Integer CVar10;
  bool bVar11;
  Integer local_40;
  
  pgVar3 = GA;
  lVar9 = g_a + 1000;
  GA[lVar9].num_rstrctd = (hi_proc - lo_proc) + 1;
  pCVar2 = (C_Integer *)malloc((hi_proc - lo_proc) * 8 + 8);
  pgVar3[lVar9].rstrctd_list = pCVar2;
  IVar6 = GAnproc;
  pCVar2 = (C_Integer *)malloc(GAnproc * 8);
  GA[lVar9].rank_rstrctd = pCVar2;
  pgVar3 = GA;
  uVar4 = GA[lVar9].p_handle;
  if (GA[lVar9].p_handle == 0xfffffffe) {
    uVar4 = GA_Default_Proc_Group;
  }
  if ((int)uVar4 < 1) {
    local_40 = IVar6;
    lVar5 = GAme;
  }
  else {
    local_40 = (Integer)PGRP_LIST[uVar4].map_nproc;
    lVar5 = (long)PGRP_LIST[uVar4].map_proc_list[GAme];
  }
  pgVar1 = GA + lVar9;
  for (lVar8 = 0; lVar8 < IVar6; lVar8 = lVar8 + 1) {
    pgVar1->rank_rstrctd[lVar8] = -1;
    IVar6 = GAnproc;
  }
  CVar10 = 0;
  CVar7 = 0;
  for (lVar8 = 0; icode = lo_proc + lVar8, icode <= hi_proc; lVar8 = lVar8 + 1) {
    bVar11 = (lo_proc - lVar5) + lVar8 == 0;
    if (bVar11) {
      CVar10 = 1;
    }
    pgVar3[lVar9].rstrctd_list[lVar8] = icode;
    if (bVar11) {
      CVar7 = lVar8;
    }
    if ((icode < 0) || (local_40 <= icode)) {
      pnga_error("Invalid processor in list",icode);
      pgVar3 = GA;
    }
    pgVar3[lVar9].rank_rstrctd[lo_proc + lVar8] = lVar8;
  }
  pgVar3[lVar9].has_data = CVar10;
  pgVar3[lVar9].rstrctd_id = CVar7;
  return;
}

Assistant:

void pnga_set_restricted_range(Integer g_a, Integer lo_proc, Integer hi_proc)
{
  Integer i, ig, id=0, me, p_handle, has_data, icnt, nproc, size;
  Integer ga_handle = g_a + GA_OFFSET;
  size = hi_proc - lo_proc + 1;
  GA[ga_handle].num_rstrctd = size;
  GA[ga_handle].rstrctd_list = (Integer*)malloc((size)*sizeof(Integer));
  GA[ga_handle].rank_rstrctd = (Integer*)malloc((GAnproc)*sizeof(Integer));
  p_handle = GA[ga_handle].p_handle;
  if (p_handle == -2) p_handle = pnga_pgroup_get_default();
  if (p_handle > 0) {
    me = PGRP_LIST[p_handle].map_proc_list[GAme];
    nproc = PGRP_LIST[p_handle].map_nproc;
  } else {
    me = GAme;
    nproc = GAnproc;
  }
  has_data = 0;

  for (i=0; i<GAnproc; i++) {
    GA[ga_handle].rank_rstrctd[i] = -1;
  }

  icnt = 0;
  for (i=lo_proc; i<=hi_proc; i++) {
    GA[ga_handle].rstrctd_list[icnt] = i;
    /* check if processor is in list */
    if (me == i) {
      has_data = 1;
      id = icnt;
    }
    /* check if processor is in group */
    if (i < 0 || i >= nproc)
      pnga_error("Invalid processor in list",i);
    ig = i;
    GA[ga_handle].rank_rstrctd[ig] = icnt;
    icnt++;
  }
  GA[ga_handle].has_data = has_data;
  GA[ga_handle].rstrctd_id = id;
}